

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_integrate
          (REF_GRID ref_grid,REF_DBL *candidate,REF_DBL *truth,REF_INT norm_power,REF_DBL *error)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  REF_INT cell;
  double dVar7;
  double dVar8;
  REF_DBL total_volume;
  REF_INT part;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_108;
  int local_fc;
  double local_f8;
  REF_MPI local_f0;
  REF_NODE local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8 [4];
  REF_INT local_a8 [30];
  
  local_f0 = ref_grid->mpi;
  local_e8 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  cell = 0;
  *error = 0.0;
  local_108 = 0.0;
  if (0 < ref_cell->max) {
    local_d8 = (double)norm_power;
    local_f8 = 0.0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,local_e8,cell,&local_fc);
        if (uVar2 != 0) {
          pcVar5 = "owner";
          uVar4 = 0xa1e;
          goto LAB_0015c359;
        }
        if (local_fc == local_f0->id) {
          uVar2 = ref_node_tet_vol(local_e8,local_a8,&local_e0);
          if (uVar2 != 0) {
            pcVar5 = "vol";
            uVar4 = 0xa20;
            goto LAB_0015c359;
          }
          local_108 = local_f8 + local_e0;
          lVar6 = 0;
          local_f8 = local_108;
          do {
            local_c8[1] = (xq[lVar6] + 1.0) * 0.5;
            local_c8[2] = (yq[lVar6] + 1.0) * 0.5;
            local_c8[3] = (zq[lVar6] + 1.0) * 0.5;
            local_c8[0] = ((1.0 - local_c8[1]) - local_c8[2]) - local_c8[3];
            if ((long)ref_cell->node_per < 1) {
              dVar8 = 0.0;
            }
            else {
              dVar7 = 0.0;
              dVar8 = 0.0;
              lVar3 = 0;
              do {
                dVar7 = dVar7 + truth[local_a8[lVar3]] * local_c8[lVar3];
                dVar8 = dVar8 + candidate[local_a8[lVar3]] * local_c8[lVar3];
                lVar3 = lVar3 + 1;
              } while (ref_cell->node_per != lVar3);
              dVar8 = dVar8 - dVar7;
            }
            if (dVar8 <= -dVar8) {
              dVar8 = -dVar8;
            }
            local_d0 = wq[lVar6] * 0.75 * local_e0;
            dVar8 = pow(dVar8,local_d8);
            *error = dVar8 * local_d0 + *error;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x18);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  ref_mpi = local_f0;
  uVar2 = ref_mpi_allsum(local_f0,error,1,3);
  if (uVar2 == 0) {
    dVar8 = pow(*error,1.0 / (double)norm_power);
    *error = dVar8;
    uVar2 = ref_mpi_allsum(ref_mpi,&local_108,1,3);
    if (uVar2 == 0) {
      *error = *error / local_108;
      return 0;
    }
    pcVar5 = "all sum";
    uVar4 = 0xa34;
  }
  else {
    pcVar5 = "all sum";
    uVar4 = 0xa32;
  }
LAB_0015c359:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar4,
         "ref_interp_integrate",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_integrate(REF_GRID ref_grid, REF_DBL *candidate,
                                        REF_DBL *truth, REF_INT norm_power,
                                        REF_DBL *error) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, cell, cell_node, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL diff, volume, total_volume, bary[4];
  REF_DBL candidate_at_gauss_point, truth_at_gauss_point;
  REF_INT part;
  *error = 0.0;
  total_volume = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part != ref_mpi_rank(ref_mpi)) continue;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    total_volume += volume;
    for (i = 0; i < nq; i++) {
      bary[1] = 0.5 * (1.0 + xq[i]);
      bary[2] = 0.5 * (1.0 + yq[i]);
      bary[3] = 0.5 * (1.0 + zq[i]);
      bary[0] = 1.0 - bary[1] - bary[2] - bary[3];
      candidate_at_gauss_point = 0.0;
      truth_at_gauss_point = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        node = nodes[cell_node];
        candidate_at_gauss_point += bary[cell_node] * candidate[node];
        truth_at_gauss_point += bary[cell_node] * truth[node];
      }
      diff = ABS(candidate_at_gauss_point - truth_at_gauss_point);
      *error += (6.0 / 8.0) * wq[i] * volume * pow(diff, norm_power);
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, error, 1, REF_DBL_TYPE), "all sum");
  *error = pow(*error, 1.0 / ((REF_DBL)norm_power));
  RSS(ref_mpi_allsum(ref_mpi, &total_volume, 1, REF_DBL_TYPE), "all sum");
  *error /= total_volume;
  return REF_SUCCESS;
}